

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::populate_grid(Plotter *this)

{
  long lVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *pvVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  int *piVar8;
  long in_RDI;
  long *in_FS_OFFSET;
  int r_1;
  int dir;
  int qsy;
  int psy;
  int qsx;
  int psx;
  PointMarker ptm_2;
  size_t id_2;
  array<double,_2UL> *q;
  array<double,_2UL> *p;
  size_t j;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *points;
  value_type *obj;
  size_t i;
  int sy_1;
  int sx_1;
  value_type *ptm_1;
  size_t id_1;
  int sy;
  int sx;
  value_type *ptm;
  size_t id;
  anon_class_24_3_02951b27 bfs;
  size_t hi;
  size_t lo;
  int r;
  value_type *in_stack_fffffffffffffe48;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  int iVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe60;
  double dVar10;
  size_type in_stack_fffffffffffffe68;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *in_stack_fffffffffffffe70;
  ulong uVar11;
  int local_138 [2];
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  value_type_conflict2 local_110;
  value_type_conflict2 local_108;
  undefined4 local_100;
  size_t local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 local_e0;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *local_d8;
  const_reference local_d0;
  const_reference local_c8;
  ulong local_c0;
  reference local_b8;
  reference local_b0;
  ulong local_a8;
  int local_a0;
  int iStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  int local_90;
  int local_8c;
  reference local_88;
  ulong local_80;
  int local_78;
  int iStack_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  int local_68;
  int local_64;
  reference local_60;
  ulong local_58;
  size_type *local_50;
  size_type *local_48;
  size_type local_38 [2];
  undefined4 local_24;
  unsigned_long *local_20;
  unsigned_long *local_18;
  undefined4 local_c;
  
  local_c = *(undefined4 *)(in_RDI + 0x128);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68);
  local_18 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe48);
  local_20 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe48);
  local_24 = 0xffffffff;
  __last._M_current._4_4_ = in_stack_fffffffffffffe5c;
  __last._M_current._0_4_ = in_stack_fffffffffffffe58;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            (in_stack_fffffffffffffe60,__last,(int *)in_stack_fffffffffffffe50);
  if ((char)in_FS_OFFSET[-0x8f] == '\0') {
    lVar1 = *in_FS_OFFSET;
    std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
              ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)0x1850bb);
    __cxa_thread_atexit(std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                        ~vector,lVar1 + -0x490,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x8f) = 1;
  }
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_38[1] = 0;
  local_38[0] = 0;
  local_50 = local_38 + 1;
  local_48 = local_38;
  for (local_58 = 0; uVar11 = local_58,
      sVar4 = std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::size
                        ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                         (in_RDI + 0x280)), uVar11 < sVar4; local_58 = local_58 + 1) {
    local_60 = std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::operator[]
                         ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                          (in_RDI + 0x280),local_58);
    if (((local_60->passive & 1U) == 0) &&
       ((local_60->drag_var_x != 0xffffffffffffffff || (local_60->drag_var_y != 0xffffffffffffffff))
       )) {
      local_64 = (int)((float)(((local_60->x - *(double *)(in_RDI + 0x18)) *
                               (double)*(int *)(in_RDI + 8)) /
                              (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18))) + 0.5);
      local_68 = (int)((float)(((*(double *)(in_RDI + 0x20) - local_60->y) *
                               (double)*(int *)(in_RDI + 0xc)) /
                              (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28))) + 0.5);
      if ((-1 < local_64) &&
         ((((-1 < local_68 && (local_64 < *(int *)(in_RDI + 8))) &&
           (local_68 < *(int *)(in_RDI + 0xc))) &&
          (pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               (in_RDI + 0x298),(long)(local_68 * *(int *)(in_RDI + 8) + local_64)),
          uVar11 = local_58, *pvVar5 == 0xffffffffffffffff)))) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            (in_RDI + 0x298),(long)(local_68 * *(int *)(in_RDI + 8) + local_64));
        sVar4 = local_38[0];
        *pvVar5 = uVar11;
        local_78 = local_68;
        iStack_74 = local_64;
        local_70 = (undefined4)local_58;
        uStack_6c = 0;
        local_38[0] = local_38[0] + 1;
        pvVar6 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                 operator[]((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                            (*in_FS_OFFSET + -0x490),sVar4);
        *(ulong *)pvVar6->_M_elems = CONCAT44(iStack_74,local_78);
        *(ulong *)(pvVar6->_M_elems + 2) = CONCAT44(uStack_6c,local_70);
      }
    }
  }
  populate_grid::anon_class_24_3_02951b27::operator()
            ((anon_class_24_3_02951b27 *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  for (local_80 = 0; uVar11 = local_80,
      sVar4 = std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::size
                        ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                         (in_RDI + 0x280)), uVar11 < sVar4; local_80 = local_80 + 1) {
    local_88 = std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::operator[]
                         ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                          (in_RDI + 0x280),local_80);
    if ((((local_88->passive & 1U) == 0) && (local_88->drag_var_x == 0xffffffffffffffff)) &&
       (local_88->drag_var_y == 0xffffffffffffffff)) {
      local_8c = (int)((float)(((local_88->x - *(double *)(in_RDI + 0x18)) *
                               (double)*(int *)(in_RDI + 8)) /
                              (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18))) + 0.5);
      local_90 = (int)((float)(((*(double *)(in_RDI + 0x20) - local_88->y) *
                               (double)*(int *)(in_RDI + 0xc)) /
                              (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28))) + 0.5);
      if (((-1 < local_8c) && (-1 < local_90)) &&
         ((local_8c < *(int *)(in_RDI + 8) &&
          ((local_90 < *(int *)(in_RDI + 0xc) &&
           (pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 0x298),(long)(local_90 * *(int *)(in_RDI + 8) + local_8c))
           , uVar11 = local_80, *pvVar5 == 0xffffffffffffffff)))))) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            (in_RDI + 0x298),(long)(local_90 * *(int *)(in_RDI + 8) + local_8c));
        sVar4 = local_38[0];
        *pvVar5 = uVar11;
        local_a0 = local_90;
        iStack_9c = local_8c;
        local_98 = (undefined4)local_80;
        uStack_94 = 0;
        local_38[0] = local_38[0] + 1;
        pvVar6 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                 operator[]((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                            (*in_FS_OFFSET + -0x490),sVar4);
        *(ulong *)pvVar6->_M_elems = CONCAT44(iStack_9c,local_a0);
        *(ulong *)(pvVar6->_M_elems + 2) = CONCAT44(uStack_94,local_98);
      }
    }
  }
  populate_grid::anon_class_24_3_02951b27::operator()
            ((anon_class_24_3_02951b27 *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  for (local_a8 = 0; uVar11 = local_a8,
      sVar4 = std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
              size((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
                   (in_RDI + 0x248)), uVar11 < sVar4; local_a8 = local_a8 + 1) {
    local_b0 = std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
               operator[]((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                           *)(in_RDI + 0x248),local_a8);
    if (local_b0->type == POLYLINE) {
      local_c0 = 1;
      local_b8 = local_b0;
      while (uVar11 = local_c0,
            sVar4 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ::size(&local_b8->points), uVar11 < sVar4) {
        local_c8 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                   operator[](&local_b8->points,local_c0 - 1);
        local_d0 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                   operator[](&local_b8->points,local_c0);
        local_d8 = (vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                   std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::size
                             ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *
                              )(in_RDI + 0x280));
        pvVar7 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffe50,
                            (size_type)in_stack_fffffffffffffe48);
        local_110 = *pvVar7;
        pvVar7 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffe50,
                            (size_type)in_stack_fffffffffffffe48);
        local_108 = *pvVar7;
        local_100 = 0;
        local_f8 = local_b0->rel_func;
        local_e0 = 1;
        local_e8 = 0xffffffffffffffff;
        local_f0 = 0xffffffffffffffff;
        std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::push_back
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        pvVar7 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffe50,
                            (size_type)in_stack_fffffffffffffe48);
        local_114 = (int)((float)(((*pvVar7 - *(double *)(in_RDI + 0x18)) *
                                  (double)*(int *)(in_RDI + 8)) /
                                 (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18))) + 0.5);
        pvVar7 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffe50,
                            (size_type)in_stack_fffffffffffffe48);
        local_118 = (int)((float)(((*pvVar7 - *(double *)(in_RDI + 0x18)) *
                                  (double)*(int *)(in_RDI + 8)) /
                                 (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18))) + 0.5);
        if (((-1 < local_114) && (local_114 < *(int *)(in_RDI + 8))) && (local_118 - local_114 < 2))
        {
          dVar10 = *(double *)(in_RDI + 0x20);
          pvVar7 = std::array<double,_2UL>::operator[]
                             ((array<double,_2UL> *)in_stack_fffffffffffffe50,
                              (size_type)in_stack_fffffffffffffe48);
          local_11c = (int)((float)(((dVar10 - *pvVar7) * (double)*(int *)(in_RDI + 0xc)) /
                                   (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28))) + 0.5)
          ;
          dVar10 = *(double *)(in_RDI + 0x20);
          pvVar7 = std::array<double,_2UL>::operator[]
                             ((array<double,_2UL> *)in_stack_fffffffffffffe50,
                              (size_type)in_stack_fffffffffffffe48);
          local_120 = (int)((float)(((dVar10 - *pvVar7) * (double)*(int *)(in_RDI + 0xc)) /
                                   (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28))) + 0.5)
          ;
          iVar3 = -1;
          if (local_11c <= local_120) {
            iVar3 = 1;
          }
          in_stack_fffffffffffffed4 = 0;
          piVar8 = std::max<int>(&local_11c,(int *)&stack0xfffffffffffffed4);
          in_stack_fffffffffffffed0 = *(int *)(in_RDI + 0xc) + -1;
          piVar8 = std::min<int>(piVar8,(int *)&stack0xfffffffffffffed0);
          local_128 = *piVar8;
          while( true ) {
            local_138[1] = 0;
            iVar9 = local_128;
            piVar8 = std::max<int>(&local_120,local_138 + 1);
            local_138[0] = *(int *)(in_RDI + 0xc) + -1;
            piVar8 = std::min<int>(piVar8,local_138);
            if (iVar9 == *piVar8 + iVar3) break;
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 0x298),
                                (long)(local_128 * *(int *)(in_RDI + 8) + local_114));
            if (*pvVar5 == 0xffffffffffffffff) {
              in_stack_fffffffffffffe50 = local_d8;
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  (in_RDI + 0x298),
                                  (long)(local_128 * *(int *)(in_RDI + 8) + local_114));
              sVar4 = local_38[0];
              pvVar2 = local_d8;
              iVar9 = local_114;
              *pvVar5 = (value_type)in_stack_fffffffffffffe50;
              local_38[0] = local_38[0] + 1;
              pvVar6 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::
                       operator[]((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                   *)(*in_FS_OFFSET + -0x490),sVar4);
              *(ulong *)pvVar6->_M_elems = CONCAT44(iVar9,local_128);
              *(ulong *)(pvVar6->_M_elems + 2) = (ulong)pvVar2 & 0xffffffff;
            }
            local_128 = iVar3 + local_128;
          }
        }
        local_c0 = local_c0 + 1;
      }
    }
  }
  populate_grid::anon_class_24_3_02951b27::operator()
            ((anon_class_24_3_02951b27 *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  return;
}

Assistant:

void Plotter::populate_grid() {
    const int r = marker_clickable_radius;
    grid.resize(view.swid * view.shigh);
    std::fill(grid.begin(), grid.end(), -1);

    thread_local std::vector<
            std::array<int, 4> // y x id dist
            > que;
    que.resize(view.swid * view.shigh);

    size_t lo = 0, hi = 0;
    auto bfs = [&]{
        // BFS to fill grid
        while(lo < hi) {
            const auto& v = que[lo++];
            int sy = v[0], sx = v[1], id = v[2], d = v[3];
            if (d >= marker_clickable_radius) continue;
            if (sy > 0 && grid[(sy - 1) * view.swid + sx] == -1) {
                que[hi++] = { sy - 1, sx, id, d + 1};
                grid[(sy - 1) * view.swid + sx] = id;
            }
            if (sx > 0 && grid[sy * view.swid + sx - 1] == -1) {
                que[hi++] = { sy, sx - 1, id, d + 1};
                grid[sy * view.swid + sx - 1] = id;
            }
            if (sx < view.swid - 1 && grid[sy * view.swid + sx + 1] == -1) {
                que[hi++] = { sy, sx + 1, id, d + 1};
                grid[sy * view.swid + sx + 1] = id;
            }
            if (sy < view.shigh - 1 && grid[(sy + 1) * view.swid + sx] == -1) {
                que[hi++] = { sy + 1, sx, id, d + 1};
                grid[(sy + 1) * view.swid + sx] = id;
            }
        }
    };

    // Pass 1: BFS from draggable markers
    for (size_t id = 0; id < pt_markers.size(); ++id) {
        auto& ptm = pt_markers[id];
        if (ptm.passive || (ptm.drag_var_x == -1 && ptm.drag_var_y == -1)) continue;
        int sx = (int)(0.5 + _X_TO_SX(ptm.x));
        int sy = (int)(0.5 + _Y_TO_SY(ptm.y));
        if (sx < 0 || sy < 0 || sx >= view.swid || sy >= view.shigh)
            continue;
        if (~grid[sy * view.swid + sx]) continue;
        grid[sy * view.swid + sx] = id;
        que[hi++] = { sy, sx, (int)id, 0 };
    }
    bfs();
    // Note: hi will be 0 here;

    // Pass 2: BFS from non-draggable, active (i.e. text-on-hover) markers
    // only goes through grid cells not already visited
    for (size_t id = 0; id < pt_markers.size(); ++id) {
        auto& ptm = pt_markers[id];
        if (ptm.passive || !(ptm.drag_var_x == -1 && ptm.drag_var_y == -1)) continue;
        int sx = (int)(0.5 + _X_TO_SX(ptm.x));
        int sy = (int)(0.5 + _Y_TO_SY(ptm.y));
        if (sx < 0 || sy < 0 || sx >= view.swid || sy >= view.shigh)
            continue;
        if (~grid[sy * view.swid + sx]) continue;
        grid[sy * view.swid + sx] = id;
        que[hi++] = { sy, sx, (int)id, 0 };
    }
    bfs();
    // Note: hi will be 0 here;

    // Pass 3: Construct and push passive markers (for clicking on functions)
    for (size_t i = 0; i < draw_buf.size(); ++i) {
        const auto & obj = draw_buf[i];
        if (obj.type == DrawBufferObject::POLYLINE) {
            const auto& points = obj.points;
            for (size_t j = 1; j < points.size(); ++j) {
                const std::array<double, 2>& p = points[j - 1];
                const std::array<double, 2>& q = points[j];
                size_t id = pt_markers.size();
                {
                    PointMarker ptm;
                    ptm.x = p[0]; ptm.y = p[1];
                    ptm.label = PointMarker::LABEL_NONE;
                    ptm.rel_func = obj.rel_func;
                    ptm.passive = true;
                    ptm.drag_var_x = ptm.drag_var_y = -1;
                    pt_markers.push_back(std::move(ptm));
                }
                int psx = (int)(0.5 + _X_TO_SX(p[0]));
                int qsx = (int)(0.5 + _X_TO_SX(q[0]));
                if (psx < 0 || psx >= view.swid || qsx - psx > 1) continue;

                int psy = (int)(0.5 + _Y_TO_SY(p[1]));
                int qsy = (int)(0.5 + _Y_TO_SY(q[1]));
                int dir = qsy >= psy ? 1 : -1;
                for (int r = std::min(std::max(psy, 0), view.shigh - 1);
                        r != std::min(std::max(qsy, 0), view.shigh - 1) + dir; r += dir) {
                    if (~grid[r * view.swid + psx]) continue;
                    grid[r * view.swid + psx] = id;
                    que[hi++] = { r, psx, (int)id, 0 };
                }
            }
        }
    }
    bfs();
}